

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAnalogEvent.cpp
# Opt level: O2

VRDataIndex *
MinVR::VRAnalogEvent::createValidDataIndex
          (VRDataIndex *__return_storage_ptr__,string *eventName,float analogValue)

{
  allocator<char> local_b6;
  allocator<char> local_b5;
  float local_b4;
  string local_b0;
  VRString local_90;
  string local_70;
  string local_50;
  string local_30;
  
  local_b4 = analogValue;
  std::__cxx11::string::string((string *)&local_70,(string *)eventName);
  VRDataIndex::VRDataIndex(__return_storage_ptr__,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"EventType",&local_b6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"AnalogUpdate",&local_b5);
  VRDataIndex::addData(&local_30,__return_storage_ptr__,&local_b0,&local_90);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"AnalogValue",&local_b6);
  VRDataIndex::addData(&local_50,__return_storage_ptr__,&local_b0,local_b4);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

VRDataIndex VRAnalogEvent::createValidDataIndex(const std::string &eventName, float analogValue) {
    VRDataIndex di(eventName);
    di.addData("EventType", "AnalogUpdate");
    di.addData("AnalogValue", analogValue);
    return di;
}